

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode * extraBddSpaceFromFunctionPos(DdManager *dd,DdNode *bF)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n;
  DdNode *pDVar5;
  DdNode *pDVar6;
  
  pDVar5 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  if (pDVar5->index == 0x7fffffff) {
    return dd->one;
  }
  pDVar2 = cuddCacheLookup1(dd,extraBddSpaceFromFunctionPos,bF);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = (pDVar5->type).kids.E;
  if (pDVar5 == bF) {
    pDVar6 = (pDVar5->type).kids.T;
  }
  else {
    pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
    pDVar6 = (DdNode *)((ulong)(pDVar5->type).kids.T ^ 1);
  }
  pDVar3 = extraBddSpaceFromFunctionPos(dd,pDVar2);
  if (pDVar3 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = extraBddSpaceFromFunctionPos(dd,pDVar6);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      n = cuddBddAndRecur(dd,pDVar3,pDVar4);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = pDVar4;
      }
      else {
        piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar3);
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar2 = extraBddSpaceFromFunctionNeg(dd,pDVar2);
        pDVar3 = n;
        if (pDVar2 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar3 = extraBddSpaceFromFunctionNeg(dd,pDVar6);
          if (pDVar3 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            pDVar3 = pDVar2;
          }
          else {
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar6 = cuddBddAndRecur(dd,pDVar2,pDVar3);
            if (pDVar6 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,pDVar2);
            }
            else {
              pDVar4 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
              pDVar4->ref = pDVar4->ref + 1;
              Cudd_RecursiveDeref(dd,pDVar2);
              Cudd_RecursiveDeref(dd,pDVar3);
              if (n == pDVar6) {
LAB_00800ce5:
                piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + -1;
                pDVar4->ref = pDVar4->ref - 1;
                cuddCacheInsert1(dd,extraBddSpaceFromFunctionPos,bF,pDVar6);
                return pDVar6;
              }
              pDVar3 = pDVar6;
              if (((ulong)pDVar6 & 1) == 0) {
                pDVar6 = cuddUniqueInter(dd,pDVar5->index,pDVar6,n);
                if (pDVar6 != (DdNode *)0x0) goto LAB_00800ce5;
                Cudd_RecursiveDeref(dd,n);
              }
              else {
                pDVar5 = cuddUniqueInter(dd,pDVar5->index,pDVar4,(DdNode *)((ulong)n ^ 1));
                if (pDVar5 != (DdNode *)0x0) {
                  pDVar6 = (DdNode *)((ulong)pDVar5 ^ 1);
                  goto LAB_00800ce5;
                }
                Cudd_RecursiveDeref(dd,n);
              }
            }
          }
        }
      }
    }
    Cudd_RecursiveDeref(dd,pDVar3);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraBddSpaceFromFunctionPos( DdManager * dd, DdNode * bF )
{
    DdNode * bRes, * bFR;
    statLine( dd );

    bFR = Cudd_Regular(bF);
    if ( cuddIsConstant(bFR) )
        return b1;

    if ( (bRes = cuddCacheLookup1(dd, extraBddSpaceFromFunctionPos, bF)) )
        return bRes;
    else
    {
        DdNode * bF0,   * bF1;
        DdNode * bPos0, * bPos1;
        DdNode * bNeg0, * bNeg1;
        DdNode * bRes0, * bRes1; 

        if ( bFR != bF ) // bF is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }


        bPos0  = extraBddSpaceFromFunctionPos( dd, bF0 );
        if ( bPos0 == NULL )
            return NULL;
        cuddRef( bPos0 );

        bPos1  = extraBddSpaceFromFunctionPos( dd, bF1 );
        if ( bPos1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bPos0 );
            return NULL;
        }
        cuddRef( bPos1 );

        bRes0  = cuddBddAndRecur( dd, bPos0, bPos1 );
        if ( bRes0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bPos0 );
            Cudd_RecursiveDeref( dd, bPos1 );
            return NULL;
        }
        cuddRef( bRes0 );
        Cudd_RecursiveDeref( dd, bPos0 );
        Cudd_RecursiveDeref( dd, bPos1 );


        bNeg0  = extraBddSpaceFromFunctionNeg( dd, bF0 );
        if ( bNeg0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bNeg0 );

        bNeg1  = extraBddSpaceFromFunctionNeg( dd, bF1 );
        if ( bNeg1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bNeg0 );
            return NULL;
        }
        cuddRef( bNeg1 );

        bRes1  = cuddBddAndRecur( dd, bNeg0, bNeg1 );
        if ( bRes1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bNeg0 );
            Cudd_RecursiveDeref( dd, bNeg1 );
            return NULL;
        }
        cuddRef( bRes1 );
        Cudd_RecursiveDeref( dd, bNeg0 );
        Cudd_RecursiveDeref( dd, bNeg1 );


        // consider the case when Res0 and Res1 are the same node 
        if ( bRes0 == bRes1 )
            bRes = bRes1;
        // consider the case when Res1 is complemented 
        else if ( Cudd_IsComplement(bRes1) ) 
        {
            bRes = cuddUniqueInter( dd, bFR->index, Cudd_Not(bRes1), Cudd_Not(bRes0) );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
            bRes = Cudd_Not(bRes);
        } 
        else 
        {
            bRes = cuddUniqueInter( dd, bFR->index, bRes1, bRes0 );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
        }
        cuddDeref( bRes0 );
        cuddDeref( bRes1 );

        cuddCacheInsert1( dd, extraBddSpaceFromFunctionPos, bF, bRes );
        return bRes;
    }
}